

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Branch * __thiscall
kj::ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::
add<kj::_::RaceSuccessfulPromiseNodeBase&,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
          (ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *this,
          RaceSuccessfulPromiseNodeBase *params,
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_1,SourceLocation *params_2)

{
  Branch *pBVar1;
  RaceSuccessfulPromiseNodeBase *params_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_1_00;
  SourceLocation *params_2_00;
  SourceLocation *params_local_2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_local_1;
  RaceSuccessfulPromiseNodeBase *params_local;
  ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *this_local;
  
  if (this->pos < this->endPtr) {
    pBVar1 = this->pos;
    params_00 = fwd<kj::_::RaceSuccessfulPromiseNodeBase&>(params);
    params_1_00 = fwd<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(params_1);
    params_2_00 = fwd<kj::SourceLocation&>(params_2);
    ctor<kj::_::RaceSuccessfulPromiseNodeBase::Branch,kj::_::RaceSuccessfulPromiseNodeBase&,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
              (pBVar1,params_00,params_1_00,params_2_00);
    pBVar1 = this->pos;
    this->pos = pBVar1 + 1;
    return pBVar1;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array.h"
             ,0x1a4,"pos < endPtr","\"Added too many elements to ArrayBuilder.\"",
             "Added too many elements to ArrayBuilder.");
}

Assistant:

T& add(Params&&... params) KJ_LIFETIMEBOUND {
    KJ_IREQUIRE(pos < endPtr, "Added too many elements to ArrayBuilder.");
    ctor(*pos, kj::fwd<Params>(params)...);
    return *pos++;
  }